

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.h
# Opt level: O0

void __thiscall sqlib::transaction_lock::~transaction_lock(transaction_lock *this)

{
  database *this_00;
  sql_error *anon_var_0;
  allocator<char> local_31;
  string local_30;
  transaction_lock *local_10;
  transaction_lock *this_local;
  
  if (((this->m_active & 1U) != 0) && ((this->m_commit_fail & 1U) == 0)) {
    this_00 = this->m_db;
    local_10 = this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"ROLLBACK",&local_31);
    database::execute_sql(this_00,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::allocator<char>::~allocator(&local_31);
  }
  return;
}

Assistant:

~transaction_lock() {
    // TODO: reexamine the m_commit_fail logic
    if(m_active && m_commit_fail == false) {
      try {
        m_db.execute_sql("ROLLBACK");
      } catch(const sql_error&) {
        // Don't let this exception fall through.
      }
    }
  }